

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

void __thiscall jaegertracing::Span::Span(Span *this,Span *span)

{
  SpanContext local_f8;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> spanLock;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  Span *span_local;
  Span *this_local;
  
  opentracing::v3::Span::Span((Span *)this);
  *(code **)this = jaegertracing::metrics::Metrics::~Metrics;
  std::shared_ptr<const_jaegertracing::Tracer>::shared_ptr
            ((shared_ptr<const_jaegertracing::Tracer> *)(this + 8));
  SpanContext::SpanContext((SpanContext *)(this + 0x18));
  std::__cxx11::string::string((string *)(this + 200));
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(this + 0xe8));
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(this + 0xf0));
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x100));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::vector
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x118));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x130));
  std::mutex::mutex((mutex *)(this + 0x148));
  std::lock<std::mutex,std::mutex>((mutex *)(this + 0x148),(mutex *)(span + 0x148));
  std::lock_guard<std::mutex>::lock_guard(&local_30,this + 0x148);
  std::lock_guard<std::mutex>::lock_guard(&local_40,span + 0x148);
  std::shared_ptr<const_jaegertracing::Tracer>::operator=
            ((shared_ptr<const_jaegertracing::Tracer> *)(this + 8),
             (shared_ptr<const_jaegertracing::Tracer> *)(span + 8));
  SpanContext::SpanContext(&local_f8,(SpanContext *)(span + 0x18));
  SpanContext::operator=((SpanContext *)(this + 0x18),&local_f8);
  SpanContext::~SpanContext(&local_f8);
  std::__cxx11::string::operator=((string *)(this + 200),(string *)(span + 200));
  *(undefined8 *)(this + 0xe8) = *(undefined8 *)(span + 0xe8);
  *(undefined8 *)(this + 0xf0) = *(undefined8 *)(span + 0xf0);
  *(undefined8 *)(this + 0xf8) = *(undefined8 *)(span + 0xf8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x100),
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(span + 0x100));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::operator=
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x118),
             (vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (span + 0x118));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::operator=
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x130),
             (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (span + 0x130));
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

Span(const Span& span)
    {
        std::lock(_mutex, span._mutex);
        std::lock_guard<std::mutex> lock(_mutex, std::adopt_lock);
        std::lock_guard<std::mutex> spanLock(span._mutex, std::adopt_lock);

        _tracer = span._tracer;
        _context = span._context;
        _operationName = span._operationName;
        _startTimeSystem = span._startTimeSystem;
        _startTimeSteady = span._startTimeSteady;
        _duration = span._duration;
        _tags = span._tags;
        _logs = span._logs;
        _references = span._references;
    }